

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Aig_Obj_t * Saig_ManFindPivot(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    local_28 = 0;
    iVar1 = Aig_ManNodeNum(p);
    if (iVar1 < 2) {
      __assert_fail("Aig_ManNodeNum(p) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                    ,0x1bc,"Aig_Obj_t *Saig_ManFindPivot(Aig_Man_t *)");
    }
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
      if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) {
        iVar1 = Aig_ManNodeNum(p);
        bVar3 = local_28 == iVar1 / 2;
        local_28 = local_28 + 1;
        if (bVar3) {
          return pAVar2;
        }
      }
    }
  }
  else {
    iVar1 = Aig_ManRegNum(p);
    if (iVar1 == 1) {
      pAVar2 = Saig_ManLo(p,0);
      return pAVar2;
    }
    for (local_24 = 0; iVar1 = Saig_ManRegNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
      p_00 = p->vCis;
      iVar1 = Saig_ManPiNum(p);
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_24 + iVar1);
      iVar1 = Aig_ManRegNum(p);
      if (local_24 == iVar1 / 2) {
        return pAVar2;
      }
    }
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

Aig_Obj_t * Saig_ManFindPivot( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter;
    if ( Aig_ManRegNum(p) > 0 )
    {
        if ( Aig_ManRegNum(p) == 1 )
            return Saig_ManLo( p, 0 );
        Saig_ManForEachLo( p, pObj, i )
        {
            if ( i == Aig_ManRegNum(p)/2 )
                return pObj;
        }
    }
    else
    {
        Counter = 0;
        assert( Aig_ManNodeNum(p) > 1 );
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( Counter++ == Aig_ManNodeNum(p)/2 )
                return pObj;
        }
    }
    return NULL;
}